

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identification_strategy.cpp
# Opt level: O2

unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
 __thiscall
license::hw_identifier::IdentificationStrategy::get_strategy
          (IdentificationStrategy *this,LCC_API_HW_IDENTIFICATION_STRATEGY strategy)

{
  Ethernet *this_00;
  logic_error *this_01;
  
  this->_vptr_IdentificationStrategy = (_func_int **)0x0;
  switch(strategy) {
  case STRATEGY_ETHERNET:
    this_00 = (Ethernet *)operator_new(0x10);
    Ethernet::Ethernet(this_00,false);
    break;
  case STRATEGY_IP_ADDRESS:
    this_00 = (Ethernet *)operator_new(0x10);
    Ethernet::Ethernet(this_00,true);
    break;
  case STRATEGY_DISK:
    this_00 = (Ethernet *)operator_new(8);
    (this_00->super_IdentificationStrategy)._vptr_IdentificationStrategy =
         (_func_int **)&PTR__DiskStrategy_0056bbe0;
    break;
  case STRATEGY_DEFAULT:
    this_00 = (Ethernet *)operator_new(8);
    DefaultStrategy::DefaultStrategy((DefaultStrategy *)this_00);
    break;
  default:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"strategy not supported");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this->_vptr_IdentificationStrategy = (_func_int **)this_00;
  return (__uniq_ptr_data<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>,_true,_true>
          )(__uniq_ptr_data<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IdentificationStrategy> IdentificationStrategy::get_strategy(LCC_API_HW_IDENTIFICATION_STRATEGY strategy) {
	unique_ptr<IdentificationStrategy> result;
	switch (strategy) {
		case STRATEGY_DEFAULT:
			result = unique_ptr<IdentificationStrategy>(dynamic_cast<IdentificationStrategy*>(new DefaultStrategy()));
			break;
		case STRATEGY_ETHERNET:
			result = unique_ptr<IdentificationStrategy>(dynamic_cast<IdentificationStrategy*>(new Ethernet(false)));
			break;
		case STRATEGY_IP_ADDRESS:
			result = unique_ptr<IdentificationStrategy>(dynamic_cast<IdentificationStrategy*>(new Ethernet(true)));
			break;
		case STRATEGY_DISK:
			result = unique_ptr<IdentificationStrategy>(dynamic_cast<IdentificationStrategy*>(new DiskStrategy()));
			break;
		default:
			throw logic_error("strategy not supported");
	}
	return result;
}